

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O0

GLFWbool chooseGLXFBConfig(_GLFWfbconfig *desired,GLXFBConfig *result)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  GLFWbool GVar4;
  char *__s1;
  uintptr_t *in_RSI;
  _GLFWfbconfig *in_RDI;
  XVisualInfo *vi;
  _GLFWfbconfig *u;
  GLXFBConfig n;
  GLFWbool trustWindowBit;
  char *vendor;
  int usableCount;
  int nativeCount;
  int i;
  _GLFWfbconfig *closest;
  _GLFWfbconfig *usableConfigs;
  GLXFBConfig *nativeConfigs;
  XVisualInfo *in_stack_ffffffffffffff98;
  _GLFWfbconfig *fbconfig;
  Visual *visual;
  uint local_3c;
  int local_38;
  int local_34;
  _GLFWfbconfig *local_30;
  _GLFWfbconfig *local_28;
  GLXFBConfig *local_20;
  uintptr_t *local_18;
  _GLFWfbconfig *local_10;
  uint local_4;
  
  bVar1 = true;
  local_18 = in_RSI;
  local_10 = in_RDI;
  __s1 = (*_glfw.glx.GetClientString)(_glfw.x11.display,1);
  if ((__s1 != (char *)0x0) && (iVar2 = strcmp(__s1,"Chromium"), iVar2 == 0)) {
    bVar1 = false;
  }
  local_20 = (*_glfw.glx.GetFBConfigs)(_glfw.x11.display,_glfw.x11.screen,&local_38);
  if ((local_20 == (GLXFBConfig *)0x0) || (local_38 == 0)) {
    _glfwInputError(0x10006,"GLX: No GLXFBConfigs returned");
    local_4 = 0;
  }
  else {
    local_28 = (_GLFWfbconfig *)calloc((long)local_38,0x48);
    local_3c = 0;
    for (local_34 = 0; local_34 < local_38; local_34 = local_34 + 1) {
      visual = (Visual *)local_20[local_34];
      fbconfig = local_28 + (int)local_3c;
      uVar3 = getGLXFBConfigAttrib
                        ((GLXFBConfig)fbconfig,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      if (((uVar3 & 1) != 0) &&
         (((uVar3 = getGLXFBConfigAttrib
                              ((GLXFBConfig)fbconfig,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20)
                              ), (uVar3 & 1) != 0 || (!bVar1)) &&
          (iVar2 = getGLXFBConfigAttrib
                             ((GLXFBConfig)fbconfig,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20))
          , iVar2 == local_10->doublebuffer)))) {
        if ((local_10->transparent != 0) &&
           (in_stack_ffffffffffffff98 =
                 (*_glfw.glx.GetVisualFromFBConfig)(_glfw.x11.display,(GLXFBConfig)visual),
           in_stack_ffffffffffffff98 != (XVisualInfo *)0x0)) {
          GVar4 = _glfwIsVisualTransparentX11(visual);
          fbconfig->transparent = GVar4;
          XFree(in_stack_ffffffffffffff98);
        }
        iVar2 = getGLXFBConfigAttrib
                          ((GLXFBConfig)fbconfig,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        fbconfig->redBits = iVar2;
        iVar2 = getGLXFBConfigAttrib
                          ((GLXFBConfig)fbconfig,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        fbconfig->greenBits = iVar2;
        iVar2 = getGLXFBConfigAttrib
                          ((GLXFBConfig)fbconfig,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        fbconfig->blueBits = iVar2;
        iVar2 = getGLXFBConfigAttrib
                          ((GLXFBConfig)fbconfig,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        fbconfig->alphaBits = iVar2;
        iVar2 = getGLXFBConfigAttrib
                          ((GLXFBConfig)fbconfig,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        fbconfig->depthBits = iVar2;
        iVar2 = getGLXFBConfigAttrib
                          ((GLXFBConfig)fbconfig,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        fbconfig->stencilBits = iVar2;
        iVar2 = getGLXFBConfigAttrib
                          ((GLXFBConfig)fbconfig,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        fbconfig->accumRedBits = iVar2;
        iVar2 = getGLXFBConfigAttrib
                          ((GLXFBConfig)fbconfig,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        fbconfig->accumGreenBits = iVar2;
        iVar2 = getGLXFBConfigAttrib
                          ((GLXFBConfig)fbconfig,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        fbconfig->accumBlueBits = iVar2;
        iVar2 = getGLXFBConfigAttrib
                          ((GLXFBConfig)fbconfig,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        fbconfig->accumAlphaBits = iVar2;
        iVar2 = getGLXFBConfigAttrib
                          ((GLXFBConfig)fbconfig,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        fbconfig->auxBuffers = iVar2;
        iVar2 = getGLXFBConfigAttrib
                          ((GLXFBConfig)fbconfig,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        if (iVar2 != 0) {
          fbconfig->stereo = 1;
        }
        if (_glfw.glx.ARB_multisample != 0) {
          iVar2 = getGLXFBConfigAttrib
                            ((GLXFBConfig)fbconfig,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
          fbconfig->samples = iVar2;
        }
        if ((_glfw.glx.ARB_framebuffer_sRGB != 0) || (_glfw.glx.EXT_framebuffer_sRGB != 0)) {
          iVar2 = getGLXFBConfigAttrib
                            ((GLXFBConfig)fbconfig,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
          fbconfig->sRGB = iVar2;
        }
        fbconfig->handle = (uintptr_t)visual;
        local_3c = local_3c + 1;
      }
    }
    local_30 = _glfwChooseFBConfig(local_10,local_28,local_3c);
    if (local_30 != (_GLFWfbconfig *)0x0) {
      *local_18 = local_30->handle;
    }
    XFree(local_20);
    free(local_28);
    local_4 = (uint)(local_30 != (_GLFWfbconfig *)0x0);
  }
  return local_4;
}

Assistant:

static GLFWbool chooseGLXFBConfig(const _GLFWfbconfig* desired,
                                  GLXFBConfig* result)
{
    GLXFBConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int i, nativeCount, usableCount;
    const char* vendor;
    GLFWbool trustWindowBit = GLFW_TRUE;

    // HACK: This is a (hopefully temporary) workaround for Chromium
    //       (VirtualBox GL) not setting the window bit on any GLXFBConfigs
    vendor = glXGetClientString(_glfw.x11.display, GLX_VENDOR);
    if (vendor && strcmp(vendor, "Chromium") == 0)
        trustWindowBit = GLFW_FALSE;

    nativeConfigs =
        glXGetFBConfigs(_glfw.x11.display, _glfw.x11.screen, &nativeCount);
    if (!nativeConfigs || !nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "GLX: No GLXFBConfigs returned");
        return GLFW_FALSE;
    }

    usableConfigs = calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (i = 0;  i < nativeCount;  i++)
    {
        const GLXFBConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider RGBA GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_RENDER_TYPE) & GLX_RGBA_BIT))
            continue;

        // Only consider window GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_DRAWABLE_TYPE) & GLX_WINDOW_BIT))
        {
            if (trustWindowBit)
                continue;
        }

        if (getGLXFBConfigAttrib(n, GLX_DOUBLEBUFFER) != desired->doublebuffer)
            continue;

        if (desired->transparent)
        {
            XVisualInfo* vi = glXGetVisualFromFBConfig(_glfw.x11.display, n);
            if (vi)
            {
                u->transparent = _glfwIsVisualTransparentX11(vi->visual);
                XFree(vi);
            }
        }

        u->redBits = getGLXFBConfigAttrib(n, GLX_RED_SIZE);
        u->greenBits = getGLXFBConfigAttrib(n, GLX_GREEN_SIZE);
        u->blueBits = getGLXFBConfigAttrib(n, GLX_BLUE_SIZE);

        u->alphaBits = getGLXFBConfigAttrib(n, GLX_ALPHA_SIZE);
        u->depthBits = getGLXFBConfigAttrib(n, GLX_DEPTH_SIZE);
        u->stencilBits = getGLXFBConfigAttrib(n, GLX_STENCIL_SIZE);

        u->accumRedBits = getGLXFBConfigAttrib(n, GLX_ACCUM_RED_SIZE);
        u->accumGreenBits = getGLXFBConfigAttrib(n, GLX_ACCUM_GREEN_SIZE);
        u->accumBlueBits = getGLXFBConfigAttrib(n, GLX_ACCUM_BLUE_SIZE);
        u->accumAlphaBits = getGLXFBConfigAttrib(n, GLX_ACCUM_ALPHA_SIZE);

        u->auxBuffers = getGLXFBConfigAttrib(n, GLX_AUX_BUFFERS);

        if (getGLXFBConfigAttrib(n, GLX_STEREO))
            u->stereo = GLFW_TRUE;

        if (_glfw.glx.ARB_multisample)
            u->samples = getGLXFBConfigAttrib(n, GLX_SAMPLES);

        if (_glfw.glx.ARB_framebuffer_sRGB || _glfw.glx.EXT_framebuffer_sRGB)
            u->sRGB = getGLXFBConfigAttrib(n, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB);

        u->handle = (uintptr_t) n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = (GLXFBConfig) closest->handle;

    XFree(nativeConfigs);
    free(usableConfigs);

    return closest != NULL;
}